

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNStat.cpp
# Opt level: O0

void __thiscall NaPNStatistics::action(NaPNStatistics *this)

{
  double dVar1;
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  NaVector *pNVar7;
  undefined4 extraout_var;
  NaReal *pNVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  NaPetriNet *pNVar9;
  NaTimer *pNVar10;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  NaVector *pNVar11;
  undefined4 extraout_var_18;
  char *pcVar12;
  NaPetriNode *in_RDI;
  double dVar13;
  NaReal stat;
  int mHaltedBy;
  int iTimeIndex;
  NaReal fTime;
  int j;
  int id;
  NaReal fAbs;
  NaVector *x;
  uint i;
  uint in_stack_fffffffffffffebc;
  uint in_stack_fffffffffffffec0;
  uint in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  uint local_130;
  uint local_12c;
  uint local_128;
  uint local_124;
  uint local_120;
  NaReal NVar14;
  uint local_38;
  int local_24;
  NaReal local_20;
  uint local_c;
  
  pNVar7 = NaPetriCnInput::data
                     ((NaPetriCnInput *)
                      CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  if ((*(uint *)&in_RDI[5].pcaPorts.field_0xc <= *(uint *)&in_RDI[5].pcaPorts.pHead) &&
     (*(int *)&in_RDI[5].pcaPorts.field_0xc != 0)) {
    NaVector::init_zero((NaVector *)0x151603);
    NaVector::init_zero((NaVector *)0x151617);
    NaVector::init_zero((NaVector *)0x15162b);
    NaVector::init_zero((NaVector *)0x15163f);
    NaVector::init_zero((NaVector *)0x151653);
    NaVector::init_zero((NaVector *)0x151667);
    NaVector::init_zero((NaVector *)0x15167b);
    *(undefined4 *)&in_RDI[5].pcaPorts.pHead = 0;
  }
  *(int *)&in_RDI[5].pcaPorts.pHead = *(int *)&in_RDI[5].pcaPorts.pHead + 1;
  for (local_c = 0; uVar4 = (*pNVar7->_vptr_NaVector[6])(), local_c < uVar4; local_c = local_c + 1)
  {
    iVar5 = (*pNVar7->_vptr_NaVector[8])(pNVar7,(ulong)local_c);
    dVar13 = *(double *)CONCAT44(extraout_var,iVar5);
    pNVar8 = NaVector::operator[]
                       ((NaVector *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                        in_stack_fffffffffffffebc);
    *pNVar8 = dVar13 + *pNVar8;
    iVar5 = (*pNVar7->_vptr_NaVector[8])(pNVar7,(ulong)local_c);
    dVar13 = *(double *)CONCAT44(extraout_var_00,iVar5);
    iVar5 = (*pNVar7->_vptr_NaVector[8])(pNVar7,(ulong)local_c);
    dVar1 = *(double *)CONCAT44(extraout_var_01,iVar5);
    pNVar8 = NaVector::operator[]
                       ((NaVector *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                        in_stack_fffffffffffffebc);
    *pNVar8 = dVar13 * dVar1 + *pNVar8;
    if (*(int *)&in_RDI[5].pcaPorts.pHead == 1) {
      iVar5 = (*pNVar7->_vptr_NaVector[8])(pNVar7,(ulong)local_c);
      NVar14 = *(NaReal *)CONCAT44(extraout_var_02,iVar5);
      pNVar8 = NaVector::operator[]
                         ((NaVector *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                          in_stack_fffffffffffffebc);
      *pNVar8 = NVar14;
      iVar5 = (*pNVar7->_vptr_NaVector[8])(pNVar7,(ulong)local_c);
      NVar14 = *(NaReal *)CONCAT44(extraout_var_03,iVar5);
      pNVar8 = NaVector::operator[]
                         ((NaVector *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                          in_stack_fffffffffffffebc);
      *pNVar8 = NVar14;
    }
    else {
      iVar5 = (*pNVar7->_vptr_NaVector[8])(pNVar7,(ulong)local_c);
      dVar13 = *(double *)CONCAT44(extraout_var_04,iVar5);
      pNVar8 = NaVector::operator[]
                         ((NaVector *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                          in_stack_fffffffffffffebc);
      if (dVar13 < *pNVar8) {
        iVar5 = (*pNVar7->_vptr_NaVector[8])(pNVar7,(ulong)local_c);
        NVar14 = *(NaReal *)CONCAT44(extraout_var_05,iVar5);
        pNVar8 = NaVector::operator[]
                           ((NaVector *)
                            CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                            in_stack_fffffffffffffebc);
        *pNVar8 = NVar14;
      }
      iVar5 = (*pNVar7->_vptr_NaVector[8])(pNVar7,(ulong)local_c);
      dVar13 = *(double *)CONCAT44(extraout_var_06,iVar5);
      pNVar8 = NaVector::operator[]
                         ((NaVector *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                          in_stack_fffffffffffffebc);
      if (*pNVar8 <= dVar13 && dVar13 != *pNVar8) {
        iVar5 = (*pNVar7->_vptr_NaVector[8])(pNVar7,(ulong)local_c);
        NVar14 = *(NaReal *)CONCAT44(extraout_var_07,iVar5);
        pNVar8 = NaVector::operator[]
                           ((NaVector *)
                            CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                            in_stack_fffffffffffffebc);
        *pNVar8 = NVar14;
      }
    }
    pNVar8 = NaVector::operator[]
                       ((NaVector *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                        in_stack_fffffffffffffebc);
    dVar13 = *pNVar8;
    uVar4 = *(uint *)&in_RDI[5].pcaPorts.pHead;
    pNVar8 = NaVector::operator[]
                       ((NaVector *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                        in_stack_fffffffffffffebc);
    *pNVar8 = dVar13 / (double)uVar4;
    pNVar8 = NaVector::operator[]
                       ((NaVector *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                        in_stack_fffffffffffffebc);
    dVar13 = *pNVar8;
    uVar4 = *(uint *)&in_RDI[5].pcaPorts.pHead;
    pNVar8 = NaVector::operator[]
                       ((NaVector *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                        in_stack_fffffffffffffebc);
    *pNVar8 = dVar13 / (double)uVar4;
    pNVar8 = NaVector::operator[]
                       ((NaVector *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                        in_stack_fffffffffffffebc);
    dVar13 = *pNVar8;
    pNVar8 = NaVector::operator[]
                       ((NaVector *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                        in_stack_fffffffffffffebc);
    dVar1 = *pNVar8;
    pNVar8 = NaVector::operator[]
                       ((NaVector *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                        in_stack_fffffffffffffebc);
    dVar13 = sqrt(-dVar1 * *pNVar8 + dVar13);
    pNVar8 = NaVector::operator[]
                       ((NaVector *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                        in_stack_fffffffffffffebc);
    *pNVar8 = dVar13;
  }
  pNVar8 = NaVector::operator[]
                     ((NaVector *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                      in_stack_fffffffffffffebc);
  dVar13 = *pNVar8;
  pNVar8 = NaVector::operator[]
                     ((NaVector *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                      in_stack_fffffffffffffebc);
  if (ABS(dVar13) <= ABS(*pNVar8)) {
    pNVar8 = NaVector::operator[]
                       ((NaVector *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                        in_stack_fffffffffffffebc);
    local_20 = *pNVar8;
  }
  else {
    pNVar8 = NaVector::operator[]
                       ((NaVector *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                        in_stack_fffffffffffffebc);
    local_20 = *pNVar8;
  }
  local_20 = ABS(local_20);
  pNVar9 = NaPetriNode::net(in_RDI);
  pNVar10 = NaPetriNet::timer(pNVar9);
  (*pNVar10->_vptr_NaTimer[4])();
  pNVar9 = NaPetriNode::net(in_RDI);
  pNVar10 = NaPetriNet::timer(pNVar9);
  iVar5 = (*pNVar10->_vptr_NaTimer[5])();
  for (local_24 = 0; local_24 < 10; local_24 = local_24 + 1) {
    uVar4 = in_RDI[5].pcaPorts.nItems & 1 << ((byte)local_24 & 0x1f);
    if (uVar4 == 1) {
      pNVar8 = NaVector::operator[]
                         ((NaVector *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                          in_stack_fffffffffffffebc);
      NVar14 = *pNVar8;
      pNVar11 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 2));
      iVar6 = (*pNVar11->_vptr_NaVector[8])();
      *(double *)CONCAT44(extraout_var_08,iVar6) = ABS(NVar14);
    }
    else if (uVar4 == 2) {
      pNVar8 = NaVector::operator[]
                         ((NaVector *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                          in_stack_fffffffffffffebc);
      NVar14 = *pNVar8;
      pNVar11 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 2));
      iVar6 = (*pNVar11->_vptr_NaVector[8])();
      *(NaReal *)CONCAT44(extraout_var_09,iVar6) = NVar14;
    }
    else if (uVar4 == 4) {
      pNVar8 = NaVector::operator[]
                         ((NaVector *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                          in_stack_fffffffffffffebc);
      NVar14 = *pNVar8;
      pNVar11 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 2));
      iVar6 = (*pNVar11->_vptr_NaVector[8])();
      *(NaReal *)CONCAT44(extraout_var_10,iVar6) = NVar14;
    }
    else if (uVar4 == 8) {
      pNVar8 = NaVector::operator[]
                         ((NaVector *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                          in_stack_fffffffffffffebc);
      NVar14 = *pNVar8;
      pNVar11 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 2));
      iVar6 = (*pNVar11->_vptr_NaVector[8])();
      *(NaReal *)CONCAT44(extraout_var_11,iVar6) = NVar14;
    }
    else if (uVar4 == 0x10) {
      pNVar8 = NaVector::operator[]
                         ((NaVector *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                          in_stack_fffffffffffffebc);
      NVar14 = *pNVar8;
      pNVar11 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 2));
      iVar6 = (*pNVar11->_vptr_NaVector[8])();
      *(NaReal *)CONCAT44(extraout_var_12,iVar6) = NVar14;
    }
    else if (uVar4 == 0x20) {
      pNVar8 = NaVector::operator[]
                         ((NaVector *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                          in_stack_fffffffffffffebc);
      NVar14 = *pNVar8;
      pNVar11 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 2));
      iVar6 = (*pNVar11->_vptr_NaVector[8])();
      *(NaReal *)CONCAT44(extraout_var_13,iVar6) = NVar14;
    }
    else if (uVar4 == 0x40) {
      pNVar11 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 2));
      iVar6 = (*pNVar11->_vptr_NaVector[8])();
      *(NaReal *)CONCAT44(extraout_var_14,iVar6) = local_20;
    }
    else if (uVar4 == 0x80) {
      pNVar11 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 2));
      iVar6 = (*pNVar11->_vptr_NaVector[8])();
      *(NaReal *)CONCAT44(extraout_var_15,iVar6) = stat;
    }
    else if (uVar4 == 0x100) {
      pNVar11 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 2));
      iVar6 = (*pNVar11->_vptr_NaVector[8])();
      *(double *)CONCAT44(extraout_var_16,iVar6) = (double)iVar5;
    }
    else if (uVar4 == 0x200) {
      iVar6 = (*pNVar7->_vptr_NaVector[8])(pNVar7,0);
      uVar2 = *(undefined8 *)CONCAT44(extraout_var_17,iVar6);
      pNVar11 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 2));
      iVar6 = (*pNVar11->_vptr_NaVector[8])();
      *(undefined8 *)CONCAT44(extraout_var_18,iVar6) = uVar2;
    }
  }
  if ((*(uint *)&in_RDI[5].pcaPorts.field_0xc <= *(uint *)&in_RDI[5].pcaPorts.pHead) &&
     (*(int *)&in_RDI[5].pcaPorts.field_0xc != 0)) {
    local_38 = 0;
    for (local_24 = 0; local_24 < 10; local_24 = local_24 + 1) {
      uVar4 = *(uint *)&in_RDI[6].pcaPorts._vptr_NaDynAr & 1 << ((byte)local_24 & 0x1f);
      if (uVar4 == 1) {
        pNVar8 = NaVector::operator[]
                           ((NaVector *)
                            CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                            in_stack_fffffffffffffebc);
        bVar3 = check_condition(ABS(*pNVar8),(&in_RDI[6].pcaPorts.nItems)[(long)local_24 * 4],
                                (NaReal)(&in_RDI[6].pcaPorts.pHead)[(long)local_24 * 2]);
        if (bVar3) {
          local_120 = 1 << ((byte)local_24 & 0x1f);
        }
        else {
          local_120 = 0;
        }
        local_38 = local_120 | local_38;
      }
      else if (uVar4 == 2) {
        pNVar8 = NaVector::operator[]
                           ((NaVector *)
                            CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                            in_stack_fffffffffffffebc);
        bVar3 = check_condition(*pNVar8,(&in_RDI[6].pcaPorts.nItems)[(long)local_24 * 4],
                                (NaReal)(&in_RDI[6].pcaPorts.pHead)[(long)local_24 * 2]);
        if (bVar3) {
          local_124 = 1 << ((byte)local_24 & 0x1f);
        }
        else {
          local_124 = 0;
        }
        local_38 = local_124 | local_38;
      }
      else if (uVar4 == 4) {
        pNVar8 = NaVector::operator[]
                           ((NaVector *)
                            CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                            in_stack_fffffffffffffebc);
        bVar3 = check_condition(*pNVar8,(&in_RDI[6].pcaPorts.nItems)[(long)local_24 * 4],
                                (NaReal)(&in_RDI[6].pcaPorts.pHead)[(long)local_24 * 2]);
        if (bVar3) {
          local_128 = 1 << ((byte)local_24 & 0x1f);
        }
        else {
          local_128 = 0;
        }
        local_38 = local_128 | local_38;
      }
      else if (uVar4 == 8) {
        pNVar8 = NaVector::operator[]
                           ((NaVector *)
                            CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                            in_stack_fffffffffffffebc);
        bVar3 = check_condition(*pNVar8,(&in_RDI[6].pcaPorts.nItems)[(long)local_24 * 4],
                                (NaReal)(&in_RDI[6].pcaPorts.pHead)[(long)local_24 * 2]);
        if (bVar3) {
          local_12c = 1 << ((byte)local_24 & 0x1f);
        }
        else {
          local_12c = 0;
        }
        local_38 = local_12c | local_38;
      }
      else if (uVar4 == 0x10) {
        pNVar8 = NaVector::operator[]
                           ((NaVector *)
                            CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                            in_stack_fffffffffffffebc);
        bVar3 = check_condition(*pNVar8,(&in_RDI[6].pcaPorts.nItems)[(long)local_24 * 4],
                                (NaReal)(&in_RDI[6].pcaPorts.pHead)[(long)local_24 * 2]);
        if (bVar3) {
          local_130 = 1 << ((byte)local_24 & 0x1f);
        }
        else {
          local_130 = 0;
        }
        local_38 = local_130 | local_38;
      }
      else if (uVar4 == 0x20) {
        pNVar8 = NaVector::operator[]
                           ((NaVector *)
                            CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                            in_stack_fffffffffffffebc);
        bVar3 = check_condition(*pNVar8,(&in_RDI[6].pcaPorts.nItems)[(long)local_24 * 4],
                                (NaReal)(&in_RDI[6].pcaPorts.pHead)[(long)local_24 * 2]);
        if (bVar3) {
          uVar4 = 1 << ((byte)local_24 & 0x1f);
        }
        else {
          uVar4 = 0;
        }
        local_38 = uVar4 | local_38;
      }
      else if (uVar4 == 0x40) {
        bVar3 = check_condition(local_20,(&in_RDI[6].pcaPorts.nItems)[(long)local_24 * 4],
                                (NaReal)(&in_RDI[6].pcaPorts.pHead)[(long)local_24 * 2]);
        if (bVar3) {
          uVar4 = 1 << ((byte)local_24 & 0x1f);
        }
        else {
          uVar4 = 0;
        }
        local_38 = uVar4 | local_38;
      }
      else if (uVar4 == 0x80) {
        bVar3 = check_condition(stat,(&in_RDI[6].pcaPorts.nItems)[(long)local_24 * 4],
                                (NaReal)(&in_RDI[6].pcaPorts.pHead)[(long)local_24 * 2]);
        if (bVar3) {
          in_stack_fffffffffffffec4 = 1 << ((byte)local_24 & 0x1f);
        }
        else {
          in_stack_fffffffffffffec4 = 0;
        }
        local_38 = in_stack_fffffffffffffec4 | local_38;
      }
      else if (uVar4 == 0x100) {
        bVar3 = check_condition((double)iVar5,(&in_RDI[6].pcaPorts.nItems)[(long)local_24 * 4],
                                (NaReal)(&in_RDI[6].pcaPorts.pHead)[(long)local_24 * 2]);
        if (bVar3) {
          in_stack_fffffffffffffec0 = 1 << ((byte)local_24 & 0x1f);
        }
        else {
          in_stack_fffffffffffffec0 = 0;
        }
        local_38 = in_stack_fffffffffffffec0 | local_38;
      }
    }
    if ((local_38 & 0x3ff) != 0) {
      pcVar12 = NaPetriNode::name(in_RDI);
      NaPrintLog("Statistics node \'%s\' caused halt due to:\n",pcVar12);
      for (local_24 = 0; local_24 < 10; local_24 = local_24 + 1) {
        if ((local_38 & 1 << ((byte)local_24 & 0x1f)) != 0) {
          NaPrintLog((char *)(&in_RDI[6].pcaPorts.pHead)[(long)local_24 * 2],"  %s[0] %s %g\n",
                     szId[local_24],szSign[(&in_RDI[6].pcaPorts.nItems)[(long)local_24 * 4] + 1]);
        }
      }
      (*in_RDI->_vptr_NaPetriNode[5])();
    }
  }
  return;
}

Assistant:

void
NaPNStatistics::action ()
{
  unsigned    i;
  NaVector    &x = signal.data();

  if(nGapAct >= nGapWidth && nGapWidth > 0)
    {
      // prepare next gap session
      Mean.init_zero();
      RMS.init_zero();
      StdDev.init_zero();
      Min.init_zero();
      Max.init_zero();

      Sum.init_zero();
      Sum2.init_zero();

      // reset activations counter
      nGapAct = 0;
    }

  // one more activation
  ++nGapAct;

  // compute basic statistics
  for(i = 0; i < x.dim(); ++i){
    Sum[i] += x[i];
    Sum2[i] += x[i] * x[i];

    if(nGapAct == 1){
      Min[i] = x[i];
      Max[i] = x[i];
    }else{
      if(x[i] < Min[i]){
	Min[i] = x[i];
      }
      if(x[i] > Max[i]){
	Max[i] = x[i];
      }
    }

    Mean[i] = Sum[i] / nGapAct;
    RMS[i] = Sum2[i] / nGapAct;
    StdDev[i] = sqrt(RMS[i] - Mean[i] * Mean[i]);

  }// for each item of input dimension

  // compute final statistics
  NaReal	fAbs;
  if(fabs(Min[0]) > fabs(Max[0]))
    fAbs = fabs(Min[0]);
  else
    fAbs = fabs(Max[0]);

  int	id, j = 0;
  NaReal	fTime = net()->timer().CurrentTime();
  int		iTimeIndex = net()->timer().CurrentIndex();

  // put needed statistics to output
  for(id = 0; id < NaSI_number; ++id){
    switch(mOutStat & NaSIdToMask(id))
      {
      case NaSM_ABSMEAN:stat.data()[j++] = fabs(Mean[0]);break;
      case NaSM_MEAN:	stat.data()[j++] = Mean[0];	break;
      case NaSM_RMS:	stat.data()[j++] = RMS[0];	break;
      case NaSM_STDDEV:	stat.data()[j++] = StdDev[0];	break;
      case NaSM_MAX:	stat.data()[j++] = Max[0];	break;
      case NaSM_MIN:	stat.data()[j++] = Min[0];	break;
      case NaSM_ABSMAX:	stat.data()[j++] = fAbs;	break;
      case NaSM_TIME:	stat.data()[j++] = fTime;	break;
      case NaSM_TINDEX: stat.data()[j++] = iTimeIndex;	break;
      case NaSM_VALUE:  stat.data()[j++] = x[0];	break;
      }
  }

  // check some statistics for halt condition
  if(nGapAct >= nGapWidth && nGapWidth > 0)
    {
      int	mHaltedBy = 0;
      for(id = 0; id < NaSI_number; ++id){
	switch(mHalt & NaSIdToMask(id))
	  {
	  case NaSM_ABSMEAN:
	    mHaltedBy |=
	      check_condition(fabs(Mean[0]), HaltCond[id].sign,
			      HaltCond[id].value)
	      ? NaSIdToMask(id) : 0;
	    break;
	  case NaSM_MEAN:
	    mHaltedBy |=
	      check_condition(Mean[0], HaltCond[id].sign, HaltCond[id].value)
	      ? NaSIdToMask(id) : 0;
	    break;
	  case NaSM_RMS:
	    mHaltedBy |=
	      check_condition(RMS[0], HaltCond[id].sign, HaltCond[id].value)
	      ? NaSIdToMask(id) : 0;
	    break;
	  case NaSM_STDDEV:
	    mHaltedBy |=
	      check_condition(StdDev[0], HaltCond[id].sign, HaltCond[id].value)
	      ? NaSIdToMask(id) : 0;
	    break;
	  case NaSM_MAX:
	    mHaltedBy |=
	      check_condition(Max[0], HaltCond[id].sign, HaltCond[id].value)
	      ? NaSIdToMask(id) : 0;
	    break;
	  case NaSM_MIN:
	    mHaltedBy |=
	      check_condition(Min[0], HaltCond[id].sign, HaltCond[id].value)
	      ? NaSIdToMask(id) : 0;
	    break;
	  case NaSM_ABSMAX:
	    mHaltedBy |=
	      check_condition(fAbs, HaltCond[id].sign, HaltCond[id].value)
	      ? NaSIdToMask(id) : 0;
	    break;
	  case NaSM_TIME:
	    mHaltedBy |=
	      check_condition(fTime, HaltCond[id].sign, HaltCond[id].value)
	      ? NaSIdToMask(id) : 0;
	    break;
	  case NaSM_TINDEX:
	    mHaltedBy |=
	      check_condition(iTimeIndex, HaltCond[id].sign, HaltCond[id].value)
	      ? NaSIdToMask(id) : 0;
	    break;
	  }// switch
      }// for each id

      // if any of halt flags is true...
      if(mHaltedBy & NaSM_ALL){
	NaPrintLog("Statistics node '%s' caused halt due to:\n", name());
	for(id = 0; id < NaSI_number; ++id){
	  if(mHaltedBy & NaSIdToMask(id))
	    NaPrintLog("  %s[0] %s %g\n", szId[id],
		       szSign[1 + HaltCond[id].sign], HaltCond[id].value);
	}

	// some halt condition results true
	halt();
      }
    }
}